

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

_Bool golf_level_get_camera_zone
                (golf_level_t *level,vec3 pos,golf_camera_zone_entity_t *camera_zone)

{
  float fVar1;
  float fVar2;
  golf_entity_t *pgVar3;
  float local_60;
  vec3 cz_scale;
  vec3 cz_pos;
  golf_entity_t *entity;
  int i;
  golf_camera_zone_entity_t *camera_zone_local;
  golf_level_t *level_local;
  float local_18;
  vec3 pos_local;
  
  entity._4_4_ = 0;
  do {
    if ((level->entities).length <= entity._4_4_) {
      return false;
    }
    pgVar3 = (level->entities).data;
    if (pgVar3[entity._4_4_].type == CAMERA_ZONE_ENTITY) {
      fVar1 = pgVar3[entity._4_4_].field_4.model.transform.rotation.x;
      fVar2 = pgVar3[entity._4_4_].field_4.camera_zone.transform.scale.z;
      local_18 = pos.x;
      cz_scale.y = (float)*(undefined8 *)((long)&pgVar3[entity._4_4_].field_4 + 4);
      local_60 = (float)*(undefined8 *)((long)&pgVar3[entity._4_4_].field_4 + 0x20);
      if ((((local_18 < cz_scale.y + local_60) && (cz_scale.y - local_60 < local_18)) &&
          (pos.z < fVar1 + fVar2)) && (fVar1 - fVar2 < pos.z)) {
        memcpy(camera_zone,&pgVar3[entity._4_4_].field_4,0x2c);
        return true;
      }
    }
    entity._4_4_ = entity._4_4_ + 1;
  } while( true );
}

Assistant:

bool golf_level_get_camera_zone(golf_level_t *level, vec3 pos, golf_camera_zone_entity_t *camera_zone) {
    for (int i = 0; i < level->entities.length; i++) {
        golf_entity_t *entity = &level->entities.data[i];
        if (entity->type != CAMERA_ZONE_ENTITY) {
            continue;
        }

        vec3 cz_pos = entity->camera_zone.transform.position;
        vec3 cz_scale = entity->camera_zone.transform.scale;
        if (pos.x < cz_pos.x + cz_scale.x && pos.x > cz_pos.x - cz_scale.x &&
                pos.z < cz_pos.z + cz_scale.z && pos.z > cz_pos.z - cz_scale.z) {
            *camera_zone = entity->camera_zone;
            return true;
        }
    }
    return false;
}